

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void * mz_zip_reader_extract_file_to_heap
                 (mz_zip_archive *pZip,char *pFilename,size_t *pSize,mz_uint flags)

{
  int iVar1;
  undefined8 *in_RDX;
  int file_index;
  mz_zip_archive *in_stack_00000020;
  mz_uint in_stack_00000034;
  char *in_stack_00000038;
  char *in_stack_00000040;
  mz_zip_archive *in_stack_00000048;
  undefined8 local_8;
  
  iVar1 = mz_zip_reader_locate_file
                    (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000034);
  if (iVar1 < 0) {
    if (in_RDX != (undefined8 *)0x0) {
      *in_RDX = 0;
    }
    local_8 = (void *)0x0;
  }
  else {
    local_8 = mz_zip_reader_extract_to_heap
                        (in_stack_00000020,pZip._4_4_,(size_t *)pFilename,pSize._4_4_);
  }
  return local_8;
}

Assistant:

void *mz_zip_reader_extract_file_to_heap(mz_zip_archive *pZip,
                                         const char *pFilename, size_t *pSize,
                                         mz_uint flags) {
  int file_index = mz_zip_reader_locate_file(pZip, pFilename, NULL, flags);
  if (file_index < 0) {
    if (pSize)
      *pSize = 0;
    return MZ_FALSE;
  }
  return mz_zip_reader_extract_to_heap(pZip, file_index, pSize, flags);
}